

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
          (Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> *this,Environment *env,
          Parameters *params)

{
  Handle<(vk::HandleType)7> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  Parameters *in_RCX;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_38;
  
  DeviceMemory::create
            ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_38,env,(Resources *)params,in_RCX);
  pVVar4 = local_38.m_data.deleter.m_allocator;
  pVVar3 = local_38.m_data.deleter.m_device;
  pDVar2 = local_38.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_38.m_data.object.m_internal;
  local_38.m_data.object.m_internal = 0;
  local_38.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_38.m_data.deleter.m_device = (VkDevice)0x0;
  local_38.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar3;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator = pVVar4;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface = pDVar2
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_38);
  return;
}

Assistant:

Dependency (const Environment& env, const typename Case::Parameters& params)
		: resources	(env, params)
		, object	(Case::create(env, resources, params))
	{}